

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.h
# Opt level: O0

void __thiscall
spvtools::opt::LoopPeeling::LoopPeeling
          (LoopPeeling *this,Loop *loop,Instruction *loop_iteration_count,
          Instruction *canonical_induction_variable)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  IRContext *pIVar5;
  TypeManager *this_00;
  Type *pTVar6;
  undefined4 extraout_var;
  Instruction *local_48;
  Instruction *canonical_induction_variable_local;
  Instruction *loop_iteration_count_local;
  Loop *loop_local;
  LoopPeeling *this_local;
  
  pIVar5 = Loop::GetContext(loop);
  this->context_ = pIVar5;
  pIVar5 = Loop::GetContext(loop);
  LoopUtils::LoopUtils(&this->loop_utils_,pIVar5,loop);
  this->loop_ = loop;
  bVar1 = Loop::IsInsideLoop(loop,loop_iteration_count);
  local_48 = loop_iteration_count;
  if (bVar1) {
    local_48 = (Instruction *)0x0;
  }
  this->loop_iteration_count_ = local_48;
  this->int_type_ = (Integer *)0x0;
  this->original_loop_canonical_induction_variable_ = canonical_induction_variable;
  this->canonical_induction_variable_ = (Instruction *)0x0;
  std::
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  ::unordered_map(&this->exit_value_);
  if (this->loop_iteration_count_ != (Instruction *)0x0) {
    this_00 = IRContext::get_type_mgr(this->context_);
    uVar2 = Instruction::type_id(this->loop_iteration_count_);
    pTVar6 = analysis::TypeManager::GetType(this_00,uVar2);
    iVar3 = (*pTVar6->_vptr_Type[9])();
    this->int_type_ = (Integer *)CONCAT44(extraout_var,iVar3);
    if (this->canonical_induction_variable_ != (Instruction *)0x0) {
      uVar2 = Instruction::type_id(this->canonical_induction_variable_);
      uVar4 = Instruction::type_id(this->loop_iteration_count_);
      if (uVar2 != uVar4) {
        __assert_fail("canonical_induction_variable_->type_id() == loop_iteration_count_->type_id() && \"loop_iteration_count and canonical_induction_variable do not \" \"have the same type\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.h"
                      ,99,
                      "spvtools::opt::LoopPeeling::LoopPeeling(Loop *, Instruction *, Instruction *)"
                     );
      }
    }
  }
  GetIteratingExitValues(this);
  return;
}

Assistant:

LoopPeeling(Loop* loop, Instruction* loop_iteration_count,
              Instruction* canonical_induction_variable = nullptr)
      : context_(loop->GetContext()),
        loop_utils_(loop->GetContext(), loop),
        loop_(loop),
        loop_iteration_count_(!loop->IsInsideLoop(loop_iteration_count)
                                  ? loop_iteration_count
                                  : nullptr),
        int_type_(nullptr),
        original_loop_canonical_induction_variable_(
            canonical_induction_variable),
        canonical_induction_variable_(nullptr) {
    if (loop_iteration_count_) {
      int_type_ = context_->get_type_mgr()
                      ->GetType(loop_iteration_count_->type_id())
                      ->AsInteger();
      if (canonical_induction_variable_) {
        assert(canonical_induction_variable_->type_id() ==
                   loop_iteration_count_->type_id() &&
               "loop_iteration_count and canonical_induction_variable do not "
               "have the same type");
      }
    }
    GetIteratingExitValues();
  }